

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptTypedNumber.cpp
# Opt level: O2

Var Js::JavascriptTypedNumber<long>::ToVar(long value,ScriptContext *scriptContext)

{
  Recycler *alloc;
  JavascriptTypedNumber<long> *this;
  undefined1 local_48 [8];
  TrackAllocData data;
  
  if ((int)value == value) {
    this = (JavascriptTypedNumber<long> *)(value & 0xffffffffU | 0x1000000000000);
  }
  else {
    local_48 = (undefined1  [8])&typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_82ff1e6;
    data.filename._0_4_ = 0x11;
    alloc = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_48);
    this = (JavascriptTypedNumber<long> *)new<Memory::Recycler>(0x18,alloc,0x6db486);
    JavascriptTypedNumber
              (this,value,
               (((scriptContext->super_ScriptContextBase).javascriptLibrary)->int64NumberTypeStatic)
               .ptr);
  }
  return this;
}

Assistant:

Var JavascriptTypedNumber<__int64>::ToVar(__int64 value, ScriptContext* scriptContext)
    {
        if (!TaggedInt::IsOverflow(value))
        {
            return TaggedInt::ToVarUnchecked((int)value);
        }
        JavascriptTypedNumber<__int64>* number = RecyclerNewLeaf(scriptContext->GetRecycler(), JavascriptInt64Number, value,
            scriptContext->GetLibrary()->GetInt64TypeStatic());
        return number;
    }